

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

Position * __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Position::operator+=(Position *this,size_t t_distance)

{
  Position local_30;
  
  operator+(&local_30,this,t_distance);
  *(ulong *)((long)&this->m_pos + 4) = CONCAT44(local_30.m_end._0_4_,local_30.m_pos._4_4_);
  *(undefined8 *)((long)&this->m_end + 4) = local_30._20_8_;
  this->line = local_30.line;
  this->col = local_30.col;
  this->m_pos = (char *)CONCAT44(local_30.m_pos._4_4_,local_30.m_pos._0_4_);
  return this;
}

Assistant:

constexpr Position &operator+=(size_t t_distance) noexcept {
          *this = (*this) + t_distance;
          return *this;
        }